

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O3

int mdb_pages_xkeep(MDB_cursor *mc,uint pflags,int all)

{
  long lVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  MDB_txn *pMVar5;
  MDB_xcursor *pMVar6;
  MDB_page **ret;
  byte bVar7;
  MDB_xcursor *pMVar8;
  int iVar9;
  ulong uVar10;
  MDB_xcursor *pMVar11;
  long lVar12;
  MDB_cursor *pMVar13;
  bool bVar14;
  int level;
  MDB_page *dp;
  int local_3c;
  long local_38;
  
  pMVar5 = mc->mc_txn;
  uVar4 = pMVar5->mt_numdbs;
  uVar10 = (ulong)uVar4;
  pMVar11 = (MDB_xcursor *)0x0;
  if ((mc->mc_flags & 0x40) == 0) {
    pMVar11 = (MDB_xcursor *)mc;
  }
  do {
    while (pMVar11 == (MDB_xcursor *)0x0) {
      bVar14 = uVar10 == 0;
      uVar10 = uVar10 - 1;
      if (bVar14) {
        if ((all != 0) && (uVar4 != 0)) {
          lVar12 = 0x28;
          uVar10 = 0;
          do {
            if (((pMVar5->mt_dbflags[uVar10] & 1) != 0) &&
               (ret = *(MDB_page ***)((long)&pMVar5->mt_dbs->md_pad + lVar12),
               ret != (MDB_page **)0xffffffffffffffff)) {
              iVar9 = mdb_page_get((MDB_cursor *)mc->mc_txn,(ulong)mc->mc_flags,ret,(int *)&local_38
                                  );
              if (iVar9 != 0) {
                return iVar9;
              }
              if (((*(ushort *)(local_38 + 10) & 0xc050) == pflags) && (local_3c < 2)) {
                *(ushort *)(local_38 + 10) = *(ushort *)(local_38 + 10) ^ 0x8000;
              }
            }
            uVar10 = uVar10 + 1;
            lVar12 = lVar12 + 0x30;
          } while (uVar10 < pMVar5->mt_numdbs);
        }
        return 0;
      }
      pMVar11 = (MDB_xcursor *)pMVar5->mt_cursors[uVar10];
    }
    bVar7 = *(byte *)((long)&pMVar11->mx_cursor + 0x44) & 1;
    pMVar8 = pMVar11;
    while (bVar7 != 0) {
      uVar2 = *(unsigned_short *)((long)&pMVar8->mx_cursor + 0x40);
      if ((ulong)uVar2 == 0) {
        lVar12 = 0xffffffff;
        pMVar13 = (MDB_cursor *)0x0;
      }
      else {
        lVar12 = -1;
        do {
          pMVar13 = *(MDB_cursor **)((long)&pMVar8->mx_cursor + (lVar12 + 10) * 8);
          uVar3 = *(ushort *)((long)&pMVar13->mc_backup + 2);
          if ((uVar3 & 0xc050) == pflags) {
            *(ushort *)((long)&pMVar13->mc_backup + 2) = uVar3 ^ 0x8000;
          }
          lVar1 = lVar12 - (ulong)uVar2;
          lVar12 = lVar12 + 1;
        } while (lVar1 != -2);
      }
      pMVar6 = *(MDB_xcursor **)((long)&pMVar8->mx_cursor + 0x10);
      if ((((pMVar6 == (MDB_xcursor *)0x0) || (pMVar13 == (MDB_cursor *)0x0)) ||
          (((pMVar6->mx_cursor).mc_flags & 1) == 0)) || (((ulong)pMVar13->mc_backup & 0x20000) == 0)
         ) break;
      bVar7 = *(byte *)((long)pMVar13->mc_pg +
                       ((ulong)*(ushort *)
                                ((long)pMVar13->mc_pg +
                                (ulong)(pMVar8->mx_cursor).mc_ki[lVar12] * 2 + -0x38) - 0x44)) & 2;
      pMVar8 = pMVar6;
    }
    pMVar11 = *(MDB_xcursor **)&pMVar11->mx_cursor;
  } while( true );
}

Assistant:

static int
mdb_pages_xkeep(MDB_cursor *mc, unsigned pflags, int all)
{
	enum { Mask = P_SUBP|P_DIRTY|P_LOOSE|P_KEEP };
	MDB_txn *txn = mc->mc_txn;
	MDB_cursor *m3, *m0 = mc;
	MDB_xcursor *mx;
	MDB_page *dp, *mp;
	MDB_node *leaf;
	unsigned i, j;
	int rc = MDB_SUCCESS, level;

	/* Mark pages seen by cursors */
	if (mc->mc_flags & C_UNTRACK)
		mc = NULL;				/* will find mc in mt_cursors */
	for (i = txn->mt_numdbs;; mc = txn->mt_cursors[--i]) {
		for (; mc; mc=mc->mc_next) {
			if (!(mc->mc_flags & C_INITIALIZED))
				continue;
			for (m3 = mc;; m3 = &mx->mx_cursor) {
				mp = NULL;
				for (j=0; j<m3->mc_snum; j++) {
					mp = m3->mc_pg[j];
					if ((mp->mp_flags & Mask) == pflags)
						mp->mp_flags ^= P_KEEP;
				}
				mx = m3->mc_xcursor;
				/* Proceed to mx if it is at a sub-database */
				if (! (mx && (mx->mx_cursor.mc_flags & C_INITIALIZED)))
					break;
				if (! (mp && (mp->mp_flags & P_LEAF)))
					break;
				leaf = NODEPTR(mp, m3->mc_ki[j-1]);
				if (!(leaf->mn_flags & F_SUBDATA))
					break;
			}
		}
		if (i == 0)
			break;
	}

	if (all) {
		/* Mark dirty root pages */
		for (i=0; i<txn->mt_numdbs; i++) {
			if (txn->mt_dbflags[i] & DB_DIRTY) {
				pgno_t pgno = txn->mt_dbs[i].md_root;
				if (pgno == P_INVALID)
					continue;
				if ((rc = mdb_page_get(m0, pgno, &dp, &level)) != MDB_SUCCESS)
					break;
				if ((dp->mp_flags & Mask) == pflags && level <= 1)
					dp->mp_flags ^= P_KEEP;
			}
		}
	}

	return rc;
}